

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testHasVolume<Imath_2_5::Vec3<short>>(char *type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  short *psVar5;
  char *in_RDI;
  Box<Imath_2_5::Vec3<short>_> b_2;
  Vec3<short> max;
  Vec3<short> min;
  Box<Imath_2_5::Vec3<short>_> b1;
  uint i;
  Vec3<short> p1;
  Vec3<short> p0;
  Box<Imath_2_5::Vec3<short>_> b0;
  Box<Imath_2_5::Vec3<short>_> b_1;
  Box<Imath_2_5::Vec3<short>_> b;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Box<Imath_2_5::Vec3<short>_> *in_stack_ffffffffffffff98;
  Box<Imath_2_5::Vec3<short>_> *in_stack_ffffffffffffffa0;
  uint local_48;
  Vec3<short> local_44;
  Vec3<short> local_3e;
  Vec3<short> local_38;
  Vec3<short> local_32 [7];
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    hasVolume() for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec3<short>_>::Box
            ((Box<Imath_2_5::Vec3<short>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec3<short>_>::hasVolume(in_stack_ffffffffffffff98);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.hasVolume()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x355,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_2_5::Vec3<short>]"
                 );
  }
  Imath_2_5::Box<Imath_2_5::Vec3<short>_>::Box
            ((Box<Imath_2_5::Vec3<short>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  Imath_2_5::Box<Imath_2_5::Vec3<short>_>::makeInfinite(in_stack_ffffffffffffffa0);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec3<short>_>::hasVolume(in_stack_ffffffffffffff98);
  if (!bVar1) {
    __assert_fail("b.hasVolume()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x35e,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_2_5::Vec3<short>]"
                 );
  }
  Imath_2_5::Vec3<short>::Vec3(local_32,-1);
  Imath_2_5::Vec3<short>::Vec3(&local_38,1);
  Imath_2_5::Box<Imath_2_5::Vec3<short>_>::Box
            (in_stack_ffffffffffffffa0,&in_stack_ffffffffffffff98->min,
             (Vec3<short> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec3<short>_>::hasVolume(in_stack_ffffffffffffff98);
  if (!bVar1) {
    __assert_fail("b0.hasVolume()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x369,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_2_5::Vec3<short>]"
                 );
  }
  Imath_2_5::Vec3<short>::Vec3(&local_3e);
  Imath_2_5::Vec3<short>::Vec3(&local_44);
  local_48 = 0;
  while( true ) {
    uVar3 = local_48;
    uVar2 = Imath_2_5::Vec3<short>::dimensions();
    if (uVar2 <= uVar3) break;
    psVar5 = Imath_2_5::Vec3<short>::operator[](&local_3e,local_48);
    *psVar5 = -(short)(1 << ((char)local_48 + 1U & 0x1f));
    uVar3 = Imath_2_5::Vec3<short>::dimensions();
    psVar5 = Imath_2_5::Vec3<short>::operator[](&local_44,local_48);
    *psVar5 = (short)(1 << ((char)uVar3 - (char)local_48 & 0x1fU));
    local_48 = local_48 + 1;
  }
  Imath_2_5::Box<Imath_2_5::Vec3<short>_>::Box
            (in_stack_ffffffffffffffa0,&in_stack_ffffffffffffff98->min,
             (Vec3<short> *)CONCAT44(in_stack_ffffffffffffff94,uVar3));
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec3<short>_>::hasVolume(in_stack_ffffffffffffff98);
  if (!bVar1) {
    __assert_fail("b1.hasVolume()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x373,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_2_5::Vec3<short>]"
                 );
  }
  Imath_2_5::Vec3<short>::Vec3((Vec3<short> *)&stack0xffffffffffffffa6,0);
  Imath_2_5::Vec3<short>::Vec3
            ((Vec3<short> *)&stack0xffffffffffffffa0,(Vec3<short> *)&stack0xffffffffffffffa6);
  uVar2 = Imath_2_5::Vec3<short>::dimensions();
  psVar5 = Imath_2_5::Vec3<short>::operator[]((Vec3<short> *)&stack0xffffffffffffffa0,uVar2 - 1);
  *psVar5 = 2;
  Imath_2_5::Box<Imath_2_5::Vec3<short>_>::Box
            (in_stack_ffffffffffffffa0,&in_stack_ffffffffffffff98->min,
             (Vec3<short> *)CONCAT44(in_stack_ffffffffffffff94,uVar3));
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec3<short>_>::hasVolume(in_stack_ffffffffffffff98);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.hasVolume()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,900,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_2_5::Vec3<short>]"
                 );
  }
  return;
}

Assistant:

void
testHasVolume(const char *type)
{
    cout << "    hasVolume() for type " << type << endl;

    //
    // Empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert(!b.hasVolume());
    }

    //
    // Infinite box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.makeInfinite();
        assert(b.hasVolume());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0(T(-1), T(1));
        assert(b0.hasVolume());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
            p0[i] = -typename T::BaseType(1 << (i + 1));
            p1[i] =  typename T::BaseType(1 << (T::dimensions() - i));
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1(p0, p1);
        assert(b1.hasVolume());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min(0);
        T max = min;
        max[T::dimensions() - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b(min, max);

        assert(!b.hasVolume());
    }
}